

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void int16_suite::test_max(void)

{
  return_type rVar1;
  value_type input [3];
  decoder decoder;
  value local_64;
  uchar local_60 [4];
  undefined4 local_5c;
  decoder local_58;
  
  local_60[2] = '\x7f';
  local_60[0] = 0xb2;
  local_60[1] = 0xff;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[3]>
            (&local_58,(uchar (*) [3])local_60);
  local_64 = local_58.current.code;
  local_5c = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x128,"void int16_suite::test_max()",&local_64,&local_5c);
  rVar1 = trial::protocol::bintoken::detail::decoder::
          overloader<trial::protocol::bintoken::token::int16>::decode(&local_58);
  local_64 = CONCAT22(local_64._2_2_,rVar1);
  local_5c = CONCAT22(local_5c._2_2_,0x7fff);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,short>
            ("decoder.value<token::int16>()","std::numeric_limits<token::int16::type>::max()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x12a,"void int16_suite::test_max()",&local_64,&local_5c);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_64 = local_58.current.code;
  local_5c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,300,"void int16_suite::test_max()",&local_64,&local_5c);
  return;
}

Assistant:

void test_max()
{
    const value_type input[] = { token::code::int16, 0xFF, 0x7F };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int16>(),
                              std::numeric_limits<token::int16::type>::max());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}